

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::tuple_caster<std::pair,bool,unsigned_long>::
       cast_impl<std::pair<bool,unsigned_long>,0ul,1ul>(char *src)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  
  if (*src == '\0') {
    entries._M_elems[0].super_handle.m_ptr = (handle)&_Py_FalseStruct;
  }
  else {
    entries._M_elems[0].super_handle.m_ptr = (handle)&_Py_TrueStruct;
  }
  ((PyObject *)entries._M_elems[0].super_handle.m_ptr)->ob_refcnt =
       ((PyObject *)entries._M_elems[0].super_handle.m_ptr)->ob_refcnt + 1;
  entries._M_elems[1].super_handle.m_ptr = (handle)PyLong_FromSize_t(*(undefined8 *)(src + 8));
  if (entries._M_elems[1].super_handle.m_ptr == (PyObject *)0x0) {
    hVar3.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple(&result,2);
    for (lVar2 = 0; hVar3.m_ptr = (PyObject *)result.super_object.super_handle.m_ptr, lVar2 != 0x10;
        lVar2 = lVar2 + 8) {
      uVar1 = *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar2);
      *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar2) = 0;
      *(undefined8 *)((long)result.super_object.super_handle.m_ptr + 0x18 + lVar2) = uVar1;
    }
    result.super_object.super_handle.m_ptr = (object)(handle)0x0;
    object::~object(&result.super_object);
  }
  std::array<pybind11::object,_2UL>::~array(&entries);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast(bool src, return_value_policy /* policy */, handle /* parent */) {
        return handle(src ? Py_True : Py_False).inc_ref();
    }